

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
* libcellml::getImportedComponents
            (vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
             *__return_storage_ptr__,ComponentEntityConstPtr *componentEntity)

{
  bool bVar1;
  element_type *peVar2;
  size_t sVar3;
  element_type *peVar4;
  size_type sVar5;
  size_type sVar6;
  iterator __first;
  iterator __last;
  __normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
  local_80;
  const_iterator local_78;
  shared_ptr<const_libcellml::ComponentEntity> local_70;
  undefined1 local_60 [8];
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  childImportedComponents;
  ComponentPtr component;
  ulong local_28;
  size_t i;
  ComponentEntityConstPtr *componentEntity_local;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  *importedComponents;
  
  std::
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  ::vector(__return_storage_ptr__);
  local_28 = 0;
  while( true ) {
    peVar2 = std::
             __shared_ptr_access<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)componentEntity);
    sVar3 = ComponentEntity::componentCount(peVar2);
    if (sVar3 <= local_28) break;
    peVar2 = std::
             __shared_ptr_access<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)componentEntity);
    ComponentEntity::component
              ((ComponentEntity *)
               &childImportedComponents.
                super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_t)peVar2);
    peVar4 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&childImportedComponents.
                            super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = ImportedEntity::isImport(&peVar4->super_ImportedEntity);
    if (bVar1) {
      std::
      vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
      ::push_back(__return_storage_ptr__,
                  (value_type *)
                  &childImportedComponents.
                   super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::shared_ptr<libcellml::ComponentEntity_const>::shared_ptr<libcellml::Component,void>
              ((shared_ptr<libcellml::ComponentEntity_const> *)&local_70,
               (shared_ptr<libcellml::Component> *)
               &childImportedComponents.
                super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    getImportedComponents
              ((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                *)local_60,(ComponentEntityConstPtr *)&local_70);
    std::shared_ptr<const_libcellml::ComponentEntity>::~shared_ptr(&local_70);
    sVar5 = std::
            vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
            ::size(__return_storage_ptr__);
    sVar6 = std::
            vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
            ::size((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                    *)local_60);
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::reserve(__return_storage_ptr__,sVar5 + sVar6);
    local_80._M_current =
         (shared_ptr<libcellml::Component> *)
         std::
         vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::Component>const*,std::vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>>
    ::__normal_iterator<std::shared_ptr<libcellml::Component>*>
              ((__normal_iterator<std::shared_ptr<libcellml::Component>const*,std::vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>>
                *)&local_78,&local_80);
    __first = std::
              vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
              ::begin((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                       *)local_60);
    __last = std::
             vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
             ::end((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                    *)local_60);
    std::
    vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>
    ::
    insert<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Component>*,std::vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>>,void>
              ((vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>
                *)__return_storage_ptr__,local_78,
               (__normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
                )__last._M_current);
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::~vector((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
               *)local_60);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)
               &childImportedComponents.
                super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_28 = local_28 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ComponentPtr> getImportedComponents(const ComponentEntityConstPtr &componentEntity)
{
    std::vector<ComponentPtr> importedComponents;
    for (size_t i = 0; i < componentEntity->componentCount(); ++i) {
        auto component = componentEntity->component(i);
        if (component->isImport()) {
            importedComponents.push_back(component);
        }

        auto childImportedComponents = getImportedComponents(component);
        importedComponents.reserve(importedComponents.size() + childImportedComponents.size());
        importedComponents.insert(importedComponents.end(), childImportedComponents.begin(), childImportedComponents.end());
    }

    return importedComponents;
}